

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_json_reader<std::istream&>
          (basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          basic_istream<char,_std::char_traits<char>_> *source,basic_json_visitor<char> *visitor,
          basic_json_decode_options<char> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  _Any_data _Stack_48;
  _Manager_type local_38;
  
  stream_source<char>::stream_source((stream_source<char> *)this,source,0x4000);
  this[0x198] = (basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>)0x1;
  *(undefined ***)(this + 0x1a0) = &PTR__basic_json_visitor_00b2f5d8;
  *(basic_json_visitor<char> **)(this + 0x1a8) = visitor;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&_Stack_48,
             err_handler);
  basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
            ((basic_json_parser<char,_std::allocator<char>_> *)(this + 0x1b0),options,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&_Stack_48,
             temp_alloc);
  if (local_38 != (code *)0x0) {
    (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
  }
  return;
}

Assistant:

basic_json_reader(Sourceable&& source,
                          basic_json_visitor<CharT>& visitor, 
                          const basic_json_decode_options<CharT>& options,
                          std::function<bool(json_errc,const ser_context&)> err_handler, 
                          const TempAllocator& temp_alloc = TempAllocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options,err_handler,temp_alloc)
        {
        }